

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

uint8_t mpack_node_u8(mpack_node_t node)

{
  mpack_type_t mVar1;
  anon_union_8_7_c87e5bf0_for_value aVar2;
  
  if ((node.tree)->error == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 != mpack_type_int) && (mVar1 != mpack_type_uint)) ||
       (aVar2 = (node.data)->value, 0xff < aVar2.u)) {
      mpack_tree_flag_error(node.tree,mpack_error_type);
      return '\0';
    }
  }
  else {
    aVar2.d = 0.0;
  }
  return aVar2._0_1_;
}

Assistant:

MPACK_INLINE uint8_t mpack_node_u8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= UINT8_MAX)
            return (uint8_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0 && node.data->value.i <= UINT8_MAX)
            return (uint8_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}